

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.h
# Opt level: O2

cmCommand * __thiscall cmGetPropertyCommand::Clone(cmGetPropertyCommand *this)

{
  cmGetPropertyCommand *this_00;
  
  this_00 = (cmGetPropertyCommand *)operator_new(0xb8);
  cmGetPropertyCommand(this_00);
  return &this_00->super_cmCommand;
}

Assistant:

virtual cmCommand* Clone()
    {
      return new cmGetPropertyCommand;
    }